

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool llvm::sys::path::has_parent_path(Twine *path,Style style)

{
  uint *puVar1;
  size_t sVar2;
  ulong uVar3;
  StringRef path_00;
  undefined1 local_b0 [8];
  SmallString<128U> path_storage;
  
  puVar1 = &path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
  path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  local_b0 = (undefined1  [8])puVar1;
  path_00 = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_b0);
  sVar2 = anon_unknown.dwarf_44276fd::parent_path_end(path_00,style);
  if (local_b0 != (undefined1  [8])puVar1) {
    free((void *)local_b0);
  }
  uVar3 = path_00.Length;
  if (sVar2 <= path_00.Length) {
    uVar3 = sVar2;
  }
  return sVar2 != 0xffffffffffffffff && uVar3 != 0;
}

Assistant:

bool has_parent_path(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !parent_path(p, style).empty();
}